

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

string * FIX::string_toLower(string *__return_storage_ptr__,string *value)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  string *value_local;
  string *copy;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,tolower);
  return __return_storage_ptr__;
}

Assistant:

std::string string_toLower(const std::string &value) {
  std::string copy = value;
  std::transform(copy.begin(), copy.end(), copy.begin(), tolower);
  return copy;
}